

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::listaddressgroupings(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_fffffffffffff6b8;
  allocator<RPCResult> *this;
  RPCResult *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffff6c0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  allocator<char> *in_stack_fffffffffffff6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff700;
  undefined7 in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff70f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff710;
  undefined7 in_stack_fffffffffffff718;
  undefined1 in_stack_fffffffffffff71f;
  undefined7 in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff727;
  string *in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff730;
  Type in_stack_fffffffffffff734;
  undefined4 in_stack_fffffffffffff738;
  Type in_stack_fffffffffffff73c;
  RPCResult *in_stack_fffffffffffff740;
  undefined1 *local_8a8;
  undefined1 *local_890;
  undefined1 *local_878;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  allocator<char> local_6ff;
  allocator<char> local_6fe;
  allocator<char> local_6fd;
  allocator<char> local_6fc [4];
  pointer local_6f8;
  pointer pRStack_6f0;
  pointer local_6e8;
  RPCMethodImpl *in_stack_fffffffffffff920;
  undefined1 local_6b9 [9];
  size_type sStack_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a8;
  undefined1 local_692;
  undefined1 local_691 [31];
  undefined1 local_672;
  undefined1 local_671 [32];
  allocator<char> local_651 [31];
  allocator<char> local_632;
  allocator<char> local_631 [25];
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  allocator<char> local_5fa;
  allocator<char> local_5f9 [449];
  undefined1 local_438 [408];
  undefined1 local_2a0 [64];
  undefined1 local_260 [136];
  undefined1 local_1d8 [64];
  undefined1 local_198 [136];
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_618 = 0;
  uStack_610 = 0;
  local_608 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  this_01 = (RPCHelpMan *)local_671;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  name = (string *)&local_672;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  description = (string *)local_691;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_692;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_6b9._1_8_ = (pointer)0x0;
  sStack_6b0 = 0;
  local_6a8._0_8_ = 0;
  results = (RPCResults *)(local_6b9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             (string *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             in_stack_fffffffffffff728,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
             (bool)in_stack_fffffffffffff71f);
  examples = (RPCExamples *)local_6b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
                 in_stack_fffffffffffff700);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             (string *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             in_stack_fffffffffffff728,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
             (bool)in_stack_fffffffffffff71f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  local_6f8 = (pointer)0x0;
  pRStack_6f0 = (pointer)0x0;
  local_6e8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6b8);
  this = (allocator<RPCResult> *)((ulong)in_stack_fffffffffffff6b8 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
             in_stack_fffffffffffff734,in_stack_fffffffffffff728,(bool)in_stack_fffffffffffff727,
             (string *)CONCAT17(in_stack_fffffffffffff71f,in_stack_fffffffffffff718),
             in_stack_fffffffffffff710,(bool)in_stack_fffffffffffff70f);
  std::allocator<RPCResult>::allocator(this);
  __l._M_len._0_7_ = in_stack_fffffffffffff708;
  __l._M_array = (iterator)in_stack_fffffffffffff700;
  __l._M_len._7_1_ = in_stack_fffffffffffff70f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8,__l,
             (allocator_type *)in_stack_fffffffffffff6f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             (string *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             in_stack_fffffffffffff728,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
             (bool)in_stack_fffffffffffff71f);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff708;
  __l_00._M_array = (iterator)in_stack_fffffffffffff700;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff70f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8,__l_00,
             (allocator_type *)in_stack_fffffffffffff6f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             (string *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             in_stack_fffffffffffff728,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
             (bool)in_stack_fffffffffffff71f);
  std::allocator<RPCResult>::allocator(this);
  __l_01._M_len._0_7_ = in_stack_fffffffffffff708;
  __l_01._M_array = (iterator)in_stack_fffffffffffff700;
  __l_01._M_len._7_1_ = in_stack_fffffffffffff70f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8,__l_01,
             (allocator_type *)in_stack_fffffffffffff6f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             (string *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
             in_stack_fffffffffffff728,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
             (bool)in_stack_fffffffffffff71f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
             (RPCResult *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleCli(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  HelpExampleRpc(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  std::operator+(in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x4bea25);
  this_00 = (RPCResult *)&stack0xfffffffffffff8e0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listaddressgroupings()::__0,void>
            (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,results,examples,in_stack_fffffffffffff920);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_6ff);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_6fe);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_6fd);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_6fc);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult(this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_878 = local_110;
  do {
    local_878 = local_878 + -0x88;
    RPCResult::~RPCResult(this_00);
  } while (local_878 != local_198);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_890 = local_1d8;
  do {
    local_890 = local_890 + -0x88;
    RPCResult::~RPCResult(this_00);
  } while (local_890 != local_260);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  local_8a8 = local_2a0;
  do {
    local_8a8 = local_8a8 + -0x88;
    RPCResult::~RPCResult(this_00);
  } while (local_8a8 != local_438);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff926);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff927);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_6b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_692);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_691);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_672);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_671);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_671 + 0x1f));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_651);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_632);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_631);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_5fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_5f9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listaddressgroupings()
{
    return RPCHelpMan{"listaddressgroupings",
                "\nLists groups of addresses which have had their common ownership\n"
                "made public by common use as inputs or as the resulting change\n"
                "in past transactions\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::ARR, "", "",
                        {
                            {RPCResult::Type::ARR_FIXED, "", "",
                            {
                                {RPCResult::Type::STR, "address", "The bitcoin address"},
                                {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                                {RPCResult::Type::STR, "label", /*optional=*/true, "The label"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listaddressgroupings", "")
            + HelpExampleRpc("listaddressgroupings", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    UniValue jsonGroupings(UniValue::VARR);
    std::map<CTxDestination, CAmount> balances = GetAddressBalances(*pwallet);
    for (const std::set<CTxDestination>& grouping : GetAddressGroupings(*pwallet)) {
        UniValue jsonGrouping(UniValue::VARR);
        for (const CTxDestination& address : grouping)
        {
            UniValue addressInfo(UniValue::VARR);
            addressInfo.push_back(EncodeDestination(address));
            addressInfo.push_back(ValueFromAmount(balances[address]));
            {
                const auto* address_book_entry = pwallet->FindAddressBookEntry(address);
                if (address_book_entry) {
                    addressInfo.push_back(address_book_entry->GetLabel());
                }
            }
            jsonGrouping.push_back(std::move(addressInfo));
        }
        jsonGroupings.push_back(std::move(jsonGrouping));
    }
    return jsonGroupings;
},
    };
}